

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

Value * __thiscall
kj::_::Debug::Context::ensureInitialized(Value *__return_storage_ptr__,Context *this)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  char *size;
  char *pcVar7;
  char *pcVar8;
  String local_58;
  char *local_38;
  
  if ((this->value).ptr.isSet == true) {
    pcVar2 = (this->value).ptr.field_1.value.file;
    iVar1 = (this->value).ptr.field_1.value.line;
    pcVar8 = (char *)(this->value).ptr.field_1.value.description.content.size_;
    pcVar7 = pcVar8;
    if (pcVar8 != (char *)0x0) {
      pcVar7 = (this->value).ptr.field_1.value.description.content.ptr;
    }
    size = (char *)0x0;
    if (pcVar8 != (char *)0x0) {
      size = pcVar8 + -1;
    }
    heapString(&local_58,pcVar7,(size_t)size);
    __return_storage_ptr__->file = pcVar2;
    __return_storage_ptr__->line = iVar1;
    (__return_storage_ptr__->description).content.ptr = local_58.content.ptr;
    (__return_storage_ptr__->description).content.size_ = local_58.content.size_;
    (__return_storage_ptr__->description).content.disposer = local_58.content.disposer;
  }
  else {
    (*(this->super_ExceptionCallback)._vptr_ExceptionCallback[7])(__return_storage_ptr__,this);
    pcVar2 = (char *)(__return_storage_ptr__->description).content.size_;
    pcVar8 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar8 = (__return_storage_ptr__->description).content.ptr;
    }
    local_38 = __return_storage_ptr__->file;
    iVar1 = __return_storage_ptr__->line;
    pcVar7 = (char *)0x0;
    if (pcVar2 != (char *)0x0) {
      pcVar7 = pcVar2 + -1;
    }
    heapString(&local_58,pcVar8,(size_t)pcVar7);
    pAVar6 = local_58.content.disposer;
    sVar5 = local_58.content.size_;
    pcVar2 = local_58.content.ptr;
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pcVar8 = (this->value).ptr.field_1.value.description.content.ptr;
      if (pcVar8 != (char *)0x0) {
        sVar3 = (this->value).ptr.field_1.value.description.content.size_;
        (this->value).ptr.field_1.value.description.content.ptr = (char *)0x0;
        (this->value).ptr.field_1.value.description.content.size_ = 0;
        pAVar4 = (this->value).ptr.field_1.value.description.content.disposer;
        (*(code *)**(undefined8 **)pAVar4)(pAVar4,pcVar8,1,sVar3,sVar3,0);
      }
    }
    sVar3 = local_58.content.size_;
    pcVar8 = local_58.content.ptr;
    (this->value).ptr.field_1.value.file = local_38;
    (this->value).ptr.field_1.value.line = iVar1;
    (this->value).ptr.field_1.value.description.content.ptr = pcVar2;
    (this->value).ptr.field_1.value.description.content.size_ = sVar5;
    (this->value).ptr.field_1.value.description.content.disposer = pAVar6;
    (this->value).ptr.isSet = true;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (*(code *)**(undefined8 **)local_58.content.disposer)
                (local_58.content.disposer,pcVar8,1,sVar3,sVar3,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Debug::Context::Value Debug::Context::ensureInitialized() {
  KJ_IF_SOME(v, value) {
    return Value(v.file, v.line, heapString(v.description));
  } else {
    Value result = evaluate();
    value = Value(result.file, result.line, heapString(result.description));
    return result;
  }